

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall agge::tests::LayoutTests::TrivialLineFeedsDoNotProduceEmptyLines(LayoutTests *this)

{
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  long lVar1;
  factory_ptr f;
  layout l;
  char_to_index indices [4];
  allocator local_4e9;
  undefined1 local_4e8 [16];
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_4d8;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_4c8;
  int local_4b4 [17];
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_470;
  _Vector_base<int,_std::allocator<int>_> local_458;
  _Vector_base<int,_std::allocator<int>_> local_440;
  _Vector_base<int,_std::allocator<int>_> local_428;
  _Vector_base<int,_std::allocator<int>_> local_410;
  _Vector_base<int,_std::allocator<int>_> local_3f8;
  _Vector_base<int,_std::allocator<int>_> local_3e0;
  _Vector_base<int,_std::allocator<int>_> local_3c8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_3b0;
  _Vector_base<int,_std::allocator<int>_> local_398;
  _Vector_base<int,_std::allocator<int>_> local_380;
  _Vector_base<int,_std::allocator<int>_> local_368;
  _Vector_base<int,_std::allocator<int>_> local_350;
  _Vector_base<int,_std::allocator<int>_> local_338;
  _Vector_base<int,_std::allocator<int>_> local_320;
  _Vector_base<int,_std::allocator<int>_> local_308;
  _Vector_base<int,_std::allocator<int>_> local_2f0;
  _Vector_base<int,_std::allocator<int>_> local_2d8;
  _Vector_base<int,_std::allocator<int>_> local_2c0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_2a8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_290;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_278;
  ref_glyph_run local_260;
  string local_228;
  ref_text_line local_208;
  LocationInfo local_1e0;
  ref_text_line local_1b8;
  richtext_t local_190;
  layout local_128;
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  end._M_current = (text_line *)local_d8;
  local_d8._16_8_ = (vector<agge::glyph_run,_std::allocator<agge::glyph_run>_> *)0x200000042;
  local_d8._24_4_ = 9.3887e-44;
  local_d8._28_4_ = 4.2039e-45;
  local_d8._0_8_ = 0x20;
  local_d8._8_8_ = 0x100000041;
  local_d8._32_4_ = 2.720083e+23;
  local_d8._36_4_ = 2.44375;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = 0x4026000000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0x402a000000000000;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0x4031000000000000;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_4e8,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,(glyph (*) [4])end._M_current);
  layout::layout(&local_128);
  std::__cxx11::string::string
            ((string *)&local_260,"ABC CBA AB\n\n\nABB BBC\n\n",(allocator *)&local_208);
  R(&local_190,(string *)&local_260);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_128,&local_190,local_4e8._0_8_);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_190);
  std::__cxx11::string::~string((string *)&local_260);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4c8,
             (__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)(local_4e8._0_8_ + 8));
  local_4b4[0x10] = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_398,(plural_ *)&plural,
                     local_4b4 + 0x10);
  local_4b4[0xf] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_380,
                   (vector<int,_std::allocator<int>_> *)&local_398,local_4b4 + 0xf);
  local_4b4[0xe] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_368,
                   (vector<int,_std::allocator<int>_> *)&local_380,local_4b4 + 0xe);
  local_4b4[0xd] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_350,
                   (vector<int,_std::allocator<int>_> *)&local_368,local_4b4 + 0xd);
  local_4b4[0xc] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_338,
                   (vector<int,_std::allocator<int>_> *)&local_350,local_4b4 + 0xc);
  local_4b4[0xb] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_320,
                   (vector<int,_std::allocator<int>_> *)&local_338,local_4b4 + 0xb);
  local_4b4[10] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_308,
                   (vector<int,_std::allocator<int>_> *)&local_320,local_4b4 + 10);
  local_4b4[9] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2f0,
                   (vector<int,_std::allocator<int>_> *)&local_308,local_4b4 + 9);
  local_4b4[8] = 1;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2d8,
                   (vector<int,_std::allocator<int>_> *)&local_2f0,local_4b4 + 8);
  local_4b4[7] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2c0,
                   (vector<int,_std::allocator<int>_> *)&local_2d8,local_4b4 + 7);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)&local_190,(shared_ptr<agge::font> *)&local_4c8,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_2c0);
  plural_::operator+(&local_2a8,(plural_ *)&plural,(ref_glyph_run *)&local_190);
  ref_text_line::ref_text_line(&local_208,0.0,10.0,0.0,&local_2a8);
  plural_::operator+(&local_290,(plural_ *)&plural,&local_208);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4d8,
             (__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)(local_4e8._0_8_ + 8));
  local_4b4[6] = 1;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_458,(plural_ *)&plural,
                     local_4b4 + 6);
  local_4b4[5] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_440,
                   (vector<int,_std::allocator<int>_> *)&local_458,local_4b4 + 5);
  local_4b4[4] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_428,
                   (vector<int,_std::allocator<int>_> *)&local_440,local_4b4 + 4);
  local_4b4[3] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_410,
                   (vector<int,_std::allocator<int>_> *)&local_428,local_4b4 + 3);
  local_4b4[2] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3f8,
                   (vector<int,_std::allocator<int>_> *)&local_410,local_4b4 + 2);
  local_4b4[1] = 2;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3e0,
                   (vector<int,_std::allocator<int>_> *)&local_3f8,local_4b4 + 1);
  local_4b4[0] = 3;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3c8,
                   (vector<int,_std::allocator<int>_> *)&local_3e0,local_4b4);
  ref_glyph_run::ref_glyph_run<int>
            (&local_260,(shared_ptr<agge::font> *)&local_4d8,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_3c8);
  plural_::operator+(&local_3b0,(plural_ *)&plural,&local_260);
  ref_text_line::ref_text_line(&local_1b8,0.0,52.0,0.0,&local_3b0);
  tests::operator+(&local_278,&local_290,&local_1b8);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_470,
             (tests *)local_128._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_128._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_4e9);
  ut::LocationInfo::LocationInfo(&local_1e0,&local_228,0x15a);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_278,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_470,
             &local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_228);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_470);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_278);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1b8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3b0);
  ref_glyph_run::~ref_glyph_run(&local_260);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3e0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3f8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_410);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_428);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_440);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_458);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d8._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_290);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_208._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2a8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)&local_190);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2c0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_308);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_320);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_338);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_350);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_368);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_380);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_398);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4c8._M_refcount);
  layout::~layout(&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4e8 + 8));
  lVar1 = 0x88;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )(local_d8 + lVar1 + 0x20));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( TrivialLineFeedsDoNotProduceEmptyLines )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);

				// ACT
				layout l;

				l.process(R("ABC CBA AB\n\n\nABB BBC\n\n"), limit::none(), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 3 + 0 + 3 + 2 + 1 + 0 + 1 + 2))
					+ ref_text_line(0.0f, 52.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 2 + 0 + 2 + 2 + 3)),
					mkvector(l.begin(), l.end()));
			}